

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.hpp
# Opt level: O2

string * __thiscall Pcode::ToString_abi_cxx11_(string *__return_storage_ptr__,Pcode *this)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator local_18c;
  allocator local_18b;
  allocator local_18a;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_168,"",(allocator *)&local_188);
  _Var1 = std::operator==(&this->m_comment,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  if (_Var1) {
    std::__cxx11::string::string((string *)&local_e8,"\t",(allocator *)&local_48);
    std::operator+(&local_c8,&this->m_num1,&local_e8);
    std::operator+(&local_a8,&local_c8,&this->m_num2);
    std::__cxx11::string::string((string *)&local_108,"\t",(allocator *)&local_68);
    std::operator+(&local_88,&local_a8,&local_108);
    std::__cxx11::string::string((string *)&local_128,pcode_string[this->m_op],&local_18b);
    std::operator+(&local_188,&local_88,&local_128);
    std::__cxx11::string::string((string *)&local_148,"\t",&local_18c);
    std::operator+(&local_168,&local_188,&local_148);
    std::operator+(__return_storage_ptr__,&local_168,&this->m_num3);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    this_00 = &local_e8;
  }
  else {
    std::__cxx11::string::string((string *)&local_128,"\t",&local_18b);
    std::operator+(&local_108,&this->m_num1,&local_128);
    std::operator+(&local_e8,&local_108,&this->m_num2);
    std::__cxx11::string::string((string *)&local_148,"\t",&local_18c);
    std::operator+(&local_c8,&local_e8,&local_148);
    std::__cxx11::string::string((string *)&local_48,pcode_string[this->m_op],&local_189);
    std::operator+(&local_a8,&local_c8,&local_48);
    std::__cxx11::string::string((string *)&local_68,"\t",&local_18a);
    std::operator+(&local_88,&local_a8,&local_68);
    std::operator+(&local_188,&local_88,&this->m_num3);
    std::operator+(&local_168,&local_188,"\t");
    std::operator+(__return_storage_ptr__,&local_168,&this->m_comment);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    this_00 = &local_128;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string ToString() {
        if (m_comment == string(""))
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3;
        else
            return m_num1 + string("\t") + m_num2 + string("\t") + string(pcode_string[m_op]) + string("\t") + m_num3 + "\t" + m_comment;
    }